

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  size_t __size;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  size_t size;
  LodePNGDecompressSettings zlibsettings;
  size_t local_60;
  LodePNGDecompressSettings local_58;
  
  local_60 = 0;
  local_58.custom_context = (decoder->zlibsettings).custom_context;
  local_58.ignore_adler32 = (decoder->zlibsettings).ignore_adler32;
  local_58.ignore_nlen = (decoder->zlibsettings).ignore_nlen;
  local_58.max_output_size = (decoder->zlibsettings).max_output_size;
  local_58.custom_zlib = (decoder->zlibsettings).custom_zlib;
  local_58.custom_inflate = (decoder->zlibsettings).custom_inflate;
  if (info->iccp_defined != 0) {
    free(info->iccp_name);
    info->iccp_name = (char *)0x0;
    free(info->iccp_profile);
    info->iccp_profile = (uchar *)0x0;
    info->iccp_profile_size = 0;
  }
  info->iccp_defined = 1;
  if (chunkLength == 0) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = (uint)uVar3;
      if (data[uVar3] == '\0') break;
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)uVar4;
    } while (uVar3 < chunkLength);
  }
  uVar5 = uVar4 + 2;
  uVar1 = 0x4b;
  if ((uVar5 < chunkLength) && (uVar1 = 0x59, 0xffffffb0 < uVar4 - 0x50)) {
    __size = (ulong)uVar4 + 1;
    pcVar2 = (char *)malloc(__size);
    info->iccp_name = pcVar2;
    if (pcVar2 == (char *)0x0) {
      uVar1 = 0x53;
    }
    else {
      pcVar2[uVar3] = '\0';
      uVar3 = 0;
      do {
        info->iccp_name[uVar3] = data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      uVar1 = 0x48;
      if (data[__size] == '\0') {
        local_58.max_output_size = decoder->max_icc_size;
        uVar4 = zlib_decompress(&info->iccp_profile,&local_60,0,data + uVar5,
                                (ulong)((int)chunkLength - uVar5),&local_58);
        uVar1 = 0x71;
        if (local_60 <= local_58.max_output_size) {
          uVar1 = uVar4;
        }
        info->iccp_profile_size = (uint)local_60;
        if ((uVar4 == 0) || (uVar1 == 0)) {
          uVar1 = 0;
          if ((uint)local_60 == 0) {
            uVar1 = 100;
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;
  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;

  if(info->iccp_defined) lodepng_clear_icc(info);
  info->iccp_defined = 1;

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  zlibsettings.max_output_size = decoder->max_icc_size;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, &zlibsettings);
  /*error: ICC profile larger than decoder->max_icc_size*/
  if(error && size > zlibsettings.max_output_size) error = 113;
  info->iccp_profile_size = (unsigned)size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}